

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_FormatNaN_Test::~FormatterTest_FormatNaN_Test(FormatterTest_FormatNaN_Test *this)

{
  void *in_RDI;
  
  ~FormatterTest_FormatNaN_Test((FormatterTest_FormatNaN_Test *)0x19fcd8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatterTest, FormatNaN) {
  double nan = std::numeric_limits<double>::quiet_NaN();
  EXPECT_EQ("nan", format("{}", nan));
  EXPECT_EQ("+nan", format("{:+}", nan));
  EXPECT_EQ(" nan", format("{: }", nan));
  EXPECT_EQ("NAN", format("{:F}", nan));
  EXPECT_EQ("nan    ", format("{:<7}", nan));
  EXPECT_EQ("  nan  ", format("{:^7}", nan));
  EXPECT_EQ("    nan", format("{:>7}", nan));
}